

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O1

curl_header * curl_easy_nextheader(CURL *easy,uint type,int request,curl_header *prev)

{
  int iVar1;
  curl_header *h;
  Curl_llist_node *n;
  void *pvVar2;
  Curl_llist_node *n_00;
  void *pvVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  if (request <= *(int *)((long)easy + 0xc70)) {
    iVar6 = *(int *)((long)easy + 0xc70);
    if (request != -1) {
      iVar6 = request;
    }
    if (prev == (curl_header *)0x0) {
      n = Curl_llist_head((Curl_llist *)((long)easy + 0x1278));
    }
    else {
      if ((Curl_llist_node *)prev->anchor == (Curl_llist_node *)0x0) {
        return (curl_header *)0x0;
      }
      n = Curl_node_next((Curl_llist_node *)prev->anchor);
    }
    for (; n != (Curl_llist_node *)0x0; n = Curl_node_next(n)) {
      pvVar2 = Curl_node_elem(n);
      if (((*(byte *)((long)pvVar2 + 0x34) & type) != 0) && (*(int *)((long)pvVar2 + 0x30) == iVar6)
         ) goto LAB_0013234e;
    }
    n = (Curl_llist_node *)0x0;
LAB_0013234e:
    if (n != (Curl_llist_node *)0x0) {
      pvVar2 = Curl_node_elem(n);
      n_00 = Curl_llist_head((Curl_llist *)((long)easy + 0x1278));
      if (n_00 == (Curl_llist_node *)0x0) {
        lVar4 = 0;
        lVar5 = 0;
      }
      else {
        lVar5 = 0;
        lVar4 = 0;
        do {
          pvVar3 = Curl_node_elem(n_00);
          iVar1 = curl_strequal(*(char **)((long)pvVar2 + 0x20),*(char **)((long)pvVar3 + 0x20));
          if ((iVar1 != 0) && (*(int *)((long)pvVar3 + 0x30) == iVar6)) {
            lVar4 = (lVar4 + 1) - (ulong)((*(byte *)((long)pvVar3 + 0x34) & type) == 0);
          }
          if (n_00 == n) {
            lVar5 = lVar4 + -1;
          }
          n_00 = Curl_node_next(n_00);
        } while (n_00 != (Curl_llist_node *)0x0);
      }
      *(undefined8 *)((long)easy + 0x12c8) = *(undefined8 *)((long)pvVar2 + 0x20);
      *(undefined8 *)((long)easy + 0x12d0) = *(undefined8 *)((long)pvVar2 + 0x28);
      *(long *)((long)easy + 0x12d8) = lVar4;
      *(long *)((long)easy + 0x12e0) = lVar5;
      *(uint *)((long)easy + 0x12e8) = *(byte *)((long)pvVar2 + 0x34) | 0x8000000;
      *(Curl_llist_node **)((long)easy + 0x12f0) = n;
      return (curl_header *)((long)easy + 0x12c8);
    }
  }
  return (curl_header *)0x0;
}

Assistant:

struct curl_header *curl_easy_nextheader(CURL *easy,
                                         unsigned int type,
                                         int request,
                                         struct curl_header *prev)
{
  struct Curl_easy *data = easy;
  struct Curl_llist_node *pick;
  struct Curl_llist_node *e;
  struct Curl_header_store *hs;
  size_t amount = 0;
  size_t index = 0;

  if(request > data->state.requests)
    return NULL;
  if(request == -1)
    request = data->state.requests;

  if(prev) {
    pick = prev->anchor;
    if(!pick)
      /* something is wrong */
      return NULL;
    pick = Curl_node_next(pick);
  }
  else
    pick = Curl_llist_head(&data->state.httphdrs);

  if(pick) {
    /* make sure it is the next header of the desired type */
    do {
      hs = Curl_node_elem(pick);
      if((hs->type & type) && (hs->request == request))
        break;
      pick = Curl_node_next(pick);
    } while(pick);
  }

  if(!pick)
    /* no more headers available */
    return NULL;

  hs = Curl_node_elem(pick);

  /* count number of occurrences of this name within the mask and figure out
     the index for the currently selected entry */
  for(e = Curl_llist_head(&data->state.httphdrs); e; e = Curl_node_next(e)) {
    struct Curl_header_store *check = Curl_node_elem(e);
    if(strcasecompare(hs->name, check->name) &&
       (check->request == request) &&
       (check->type & type))
      amount++;
    if(e == pick)
      index = amount - 1;
  }

  copy_header_external(hs, index, amount, pick,
                       &data->state.headerout[1]);
  return &data->state.headerout[1];
}